

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getFieldFromAcroForm(QPDFFormFieldObjectHelper *this,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  QPDF *pQVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle result;
  QPDFObjectHandle acroform;
  allocator<char> local_79;
  _func_int **local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40 [2];
  
  QPDFObjectHandle::newNull();
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&name->_M_string_length);
  pQVar3 = QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)(local_50 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
  _Var1._M_pi = a_Stack_70[0]._M_pi;
  if (pQVar3 == (QPDF *)0x0) {
    a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = local_78;
    (this->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
    local_78 = (_func_int **)0x0;
  }
  else {
    QPDF::getRoot((QPDF *)local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_50 + 0x10),"/AcroForm",&local_79);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_60,(string *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_60);
    _Var1._M_pi = a_Stack_70[0]._M_pi;
    if (bVar2) {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_60);
    }
    else {
      a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = local_78;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var1._M_pi;
      local_78 = (_func_int **)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getFieldFromAcroForm(std::string const& name)
{
    QPDFObjectHandle result = QPDFObjectHandle::newNull();
    // Fields are supposed to be indirect, so this should work.
    QPDF* q = oh().getOwningQPDF();
    if (!q) {
        return result;
    }
    auto acroform = q->getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        return result;
    }
    return acroform.getKey(name);
}